

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

bool __thiscall
QGenericItemModel::insertRows(QGenericItemModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  long in_FS_OFFSET;
  int count_local;
  int row_local;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  count_local = count;
  row_local = row;
  bVar1 = QGenericItemModelImplBase::call<bool,int,int,QModelIndex>
                    (*(QGenericItemModelImplBase **)(this + 0x10),InsertRows,&row_local,&count_local
                     ,parent);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::insertRows(int row, int count, const QModelIndex &parent)
{
    return impl->call<bool>(QGenericItemModelImplBase::InsertRows, row, count, parent);
}